

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

Ownership __thiscall TCMallocImplementation::GetOwnership(TCMallocImplementation *this,void *ptr)

{
  ulong uVar1;
  
  if ((ulong)ptr >> 0x30 == 0) {
    uVar1 = (ulong)ptr >> 0xd;
    if (((uVar1 & 0xffffffffffff0000 ^
         *(ulong *)(tcmalloc::Static::pageheap_ + (uVar1 & 0xffff) * 8 + 0x10)) < 0x80) ||
       ((*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) != 0 &&
        (*(long *)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) +
                  (ulong)((uint)uVar1 & 0x3ffff) * 8) != 0)))) {
      return kOwned;
    }
  }
  return kNotOwned;
}

Assistant:

virtual Ownership GetOwnership(const void* ptr) {
    const PageID p = reinterpret_cast<uintptr_t>(ptr) >> kPageShift;
    // The rest of tcmalloc assumes that all allocated pointers use at
    // most kAddressBits bits.  If ptr doesn't, then it definitely
    // wasn't alloacted by tcmalloc.
    if ((p >> (kAddressBits - kPageShift)) > 0) {
      return kNotOwned;
    }
    uint32_t cl;
    if (Static::pageheap()->TryGetSizeClass(p, &cl)) {
      return kOwned;
    }
    const Span *span = Static::pageheap()->GetDescriptor(p);
    if (span) {
      return kOwned;
    }
    return tcmalloc::IsEmergencyPtr(ptr) ? kOwned : kNotOwned;
  }